

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compilation.cpp
# Opt level: O2

pair<slang::ast::Compilation::DefinitionLookupResult,_bool> * __thiscall
slang::ast::Compilation::resolveConfigRule
          (pair<slang::ast::Compilation::DefinitionLookupResult,_bool> *__return_storage_ptr__,
          Compilation *this,Scope *scope,ConfigRule *rule)

{
  string_view *sv;
  group_type_pointer pgVar1;
  group_type_pointer pgVar2;
  group_type_pointer pgVar3;
  value_type_pointer ppVar4;
  ulong uVar5;
  ConfigRule *pCVar6;
  group_type_pointer pgVar7;
  value_type_pointer ppVar8;
  uint uVar9;
  uchar uVar10;
  uchar uVar11;
  uchar uVar12;
  byte bVar13;
  bool bVar14;
  byte bVar15;
  uint uVar16;
  SourceLibrary *target;
  Diagnostic *pDVar17;
  DefinitionSymbol *pDVar18;
  uint64_t uVar19;
  remove_reference_t<decltype(defList[0])>_conflict this_00;
  size_t sVar20;
  remove_reference_t<decltype(defList[0])> pSVar21;
  ulong uVar22;
  value_type_pointer __y;
  value_type_pointer __u;
  ulong uVar23;
  long lVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  string_view name;
  span<const_slang::ast::ConfigBlockSymbol::TopCell,_18446744073709551615UL> sVar27;
  SourceRange SVar28;
  tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*> local_48;
  
  rule->isUsed = true;
  sVar20 = (rule->useCell).lib._M_len;
  if (sVar20 == 0) {
    target = this->defaultLibPtr;
    pDVar18 = Symbol::getDeclaringDefinition(scope->thisSym);
    if (pDVar18 != (DefinitionSymbol *)0x0) {
      target = pDVar18->sourceLibrary;
    }
  }
  else {
    name._M_str = (rule->useCell).lib._M_str;
    name._M_len = sVar20;
    target = getSourceLibrary(this,name);
    if (target == (SourceLibrary *)0x0) {
      pDVar17 = Scope::addDiag(&((this->root)._M_t.
                                 super___uniq_ptr_impl<slang::ast::RootSymbol,_std::default_delete<slang::ast::RootSymbol>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_slang::ast::RootSymbol_*,_std::default_delete<slang::ast::RootSymbol>_>
                                 .super__Head_base<0UL,_slang::ast::RootSymbol_*,_false>.
                                _M_head_impl)->super_Scope,(DiagCode)0x20000d,
                               (rule->useCell).sourceRange);
      Diagnostic::operator<<(pDVar17,(rule->useCell).lib);
      goto LAB_0025ecc2;
    }
  }
  if ((rule->useCell).targetConfig == false) {
    local_48.
    super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
    .super__Tuple_impl<1UL,_const_slang::ast::Scope_*>.
    super__Head_base<1UL,_const_slang::ast::Scope_*,_false>._M_head_impl =
         (_Head_base<1UL,_const_slang::ast::Scope_*,_false>)
         (this->root)._M_t.
         super___uniq_ptr_impl<slang::ast::RootSymbol,_std::default_delete<slang::ast::RootSymbol>_>
         ._M_t.
         super__Tuple_impl<0UL,_slang::ast::RootSymbol_*,_std::default_delete<slang::ast::RootSymbol>_>
         .super__Head_base<0UL,_slang::ast::RootSymbol_*,_false>._M_head_impl;
    if (local_48.
        super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
        .super__Tuple_impl<1UL,_const_slang::ast::Scope_*>.
        super__Head_base<1UL,_const_slang::ast::Scope_*,_false>._M_head_impl != (Scope *)0x0) {
      local_48.
      super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
      .super__Tuple_impl<1UL,_const_slang::ast::Scope_*>.
      super__Head_base<1UL,_const_slang::ast::Scope_*,_false>._M_head_impl =
           (_Head_base<1UL,_const_slang::ast::Scope_*,_false>)
           (_Head_base<1UL,_const_slang::ast::Scope_*,_false>)
           &((RootSymbol *)
            local_48.
            super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
            .super__Tuple_impl<1UL,_const_slang::ast::Scope_*>.
            super__Head_base<1UL,_const_slang::ast::Scope_*,_false>._M_head_impl)->super_Scope;
    }
    local_48.
    super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
    .super__Head_base<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>.
    _M_head_impl._M_len = (rule->useCell).name._M_len;
    local_48.
    super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
    .super__Head_base<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>.
    _M_head_impl._M_str = (rule->useCell).name._M_str;
    sVar20 = boost::unordered::detail::foa::mulx_mix::
             mix<slang::hash<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,void>,std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>>
                       ((hash<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_void>
                         *)&this->definitionMap,&local_48);
    uVar22 = sVar20 >> ((byte)(this->definitionMap).table_.
                              super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>,_slang::hash<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>_>_>
                              .arrays.groups_size_index & 0x3f);
    lVar24 = (sVar20 & 0xff) * 4;
    uVar10 = (&UNK_0040eb5c)[lVar24];
    uVar11 = (&UNK_0040eb5d)[lVar24];
    uVar12 = (&UNK_0040eb5e)[lVar24];
    bVar13 = (&UNK_0040eb5f)[lVar24];
    uVar23 = 0;
    do {
      pgVar7 = (this->definitionMap).table_.
               super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>,_slang::hash<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>_>_>
               .arrays.groups_;
      pgVar2 = pgVar7 + uVar22;
      bVar15 = pgVar2->m[0xf].n;
      auVar26[0] = -(pgVar2->m[0].n == uVar10);
      auVar26[1] = -(pgVar2->m[1].n == uVar11);
      auVar26[2] = -(pgVar2->m[2].n == uVar12);
      auVar26[3] = -(pgVar2->m[3].n == bVar13);
      auVar26[4] = -(pgVar2->m[4].n == uVar10);
      auVar26[5] = -(pgVar2->m[5].n == uVar11);
      auVar26[6] = -(pgVar2->m[6].n == uVar12);
      auVar26[7] = -(pgVar2->m[7].n == bVar13);
      auVar26[8] = -(pgVar2->m[8].n == uVar10);
      auVar26[9] = -(pgVar2->m[9].n == uVar11);
      auVar26[10] = -(pgVar2->m[10].n == uVar12);
      auVar26[0xb] = -(pgVar2->m[0xb].n == bVar13);
      auVar26[0xc] = -(pgVar2->m[0xc].n == uVar10);
      auVar26[0xd] = -(pgVar2->m[0xd].n == uVar11);
      auVar26[0xe] = -(pgVar2->m[0xe].n == uVar12);
      auVar26[0xf] = -(bVar15 == bVar13);
      uVar16 = (uint)(ushort)((ushort)(SUB161(auVar26 >> 7,0) & 1) |
                              (ushort)(SUB161(auVar26 >> 0xf,0) & 1) << 1 |
                              (ushort)(SUB161(auVar26 >> 0x17,0) & 1) << 2 |
                              (ushort)(SUB161(auVar26 >> 0x1f,0) & 1) << 3 |
                              (ushort)(SUB161(auVar26 >> 0x27,0) & 1) << 4 |
                              (ushort)(SUB161(auVar26 >> 0x2f,0) & 1) << 5 |
                              (ushort)(SUB161(auVar26 >> 0x37,0) & 1) << 6 |
                              (ushort)(SUB161(auVar26 >> 0x3f,0) & 1) << 7 |
                              (ushort)(SUB161(auVar26 >> 0x47,0) & 1) << 8 |
                              (ushort)(SUB161(auVar26 >> 0x4f,0) & 1) << 9 |
                              (ushort)(SUB161(auVar26 >> 0x57,0) & 1) << 10 |
                              (ushort)(SUB161(auVar26 >> 0x5f,0) & 1) << 0xb |
                              (ushort)(SUB161(auVar26 >> 0x67,0) & 1) << 0xc |
                              (ushort)(SUB161(auVar26 >> 0x6f,0) & 1) << 0xd |
                             (ushort)(SUB161(auVar26 >> 0x77,0) & 1) << 0xe);
      if (uVar16 != 0) {
        ppVar8 = (this->definitionMap).table_.
                 super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>,_slang::hash<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>_>_>
                 .arrays.elements_;
        do {
          uVar9 = 0;
          if (uVar16 != 0) {
            for (; (uVar16 >> uVar9 & 1) == 0; uVar9 = uVar9 + 1) {
            }
          }
          __u = ppVar8 + uVar22 * 0xf + (ulong)uVar9;
          bVar14 = std::
                   __tuple_compare<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_0UL,_2UL>
                   ::__eq(&local_48,&__u->first);
          if (bVar14) {
            pSVar21 = findDefByLib<std::vector<slang::ast::Symbol*,std::allocator<slang::ast::Symbol*>>const>
                                (&(__u->second).first,target);
            if (pSVar21 == (remove_reference_t<decltype(defList[0])>)0x0) goto LAB_0025e8c5;
            (__return_storage_ptr__->first).definition = pSVar21;
            (__return_storage_ptr__->first).configRoot = (ConfigBlockSymbol *)0x0;
            (__return_storage_ptr__->first).configRule = rule;
            goto LAB_0025eccf;
          }
          uVar16 = uVar16 - 1 & uVar16;
        } while (uVar16 != 0);
        bVar15 = pgVar7[uVar22].m[0xf].n;
      }
      if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
             is_not_overflowed(unsigned_long)::shift)[(uint)sVar20 & 7] & bVar15) == 0) break;
      uVar5 = (this->definitionMap).table_.
              super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>,_slang::hash<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>_>_>
              .arrays.groups_size_mask;
      lVar24 = uVar22 + uVar23;
      uVar23 = uVar23 + 1;
      uVar22 = lVar24 + 1U & uVar5;
    } while (uVar23 <= uVar5);
  }
LAB_0025e8c5:
  sv = &(rule->useCell).name;
  uVar19 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                     ((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)
                      &this->configBlocks,sv);
  uVar23 = uVar19 >> ((byte)(this->configBlocks).table_.
                            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_std::vector<const_slang::ast::ConfigBlockSymbol_*>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_std::vector<const_slang::ast::ConfigBlockSymbol_*>_>_>_>
                            .arrays.groups_size_index & 0x3f);
  lVar24 = (uVar19 & 0xff) * 4;
  uVar10 = (&UNK_0040eb5c)[lVar24];
  uVar11 = (&UNK_0040eb5d)[lVar24];
  uVar12 = (&UNK_0040eb5e)[lVar24];
  bVar13 = (&UNK_0040eb5f)[lVar24];
  uVar22 = 0;
  do {
    pgVar3 = (this->configBlocks).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_std::vector<const_slang::ast::ConfigBlockSymbol_*>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_std::vector<const_slang::ast::ConfigBlockSymbol_*>_>_>_>
             .arrays.groups_;
    pgVar1 = pgVar3 + uVar23;
    bVar15 = pgVar1->m[0xf].n;
    auVar25[0] = -(pgVar1->m[0].n == uVar10);
    auVar25[1] = -(pgVar1->m[1].n == uVar11);
    auVar25[2] = -(pgVar1->m[2].n == uVar12);
    auVar25[3] = -(pgVar1->m[3].n == bVar13);
    auVar25[4] = -(pgVar1->m[4].n == uVar10);
    auVar25[5] = -(pgVar1->m[5].n == uVar11);
    auVar25[6] = -(pgVar1->m[6].n == uVar12);
    auVar25[7] = -(pgVar1->m[7].n == bVar13);
    auVar25[8] = -(pgVar1->m[8].n == uVar10);
    auVar25[9] = -(pgVar1->m[9].n == uVar11);
    auVar25[10] = -(pgVar1->m[10].n == uVar12);
    auVar25[0xb] = -(pgVar1->m[0xb].n == bVar13);
    auVar25[0xc] = -(pgVar1->m[0xc].n == uVar10);
    auVar25[0xd] = -(pgVar1->m[0xd].n == uVar11);
    auVar25[0xe] = -(pgVar1->m[0xe].n == uVar12);
    auVar25[0xf] = -(bVar15 == bVar13);
    uVar16 = (uint)(ushort)((ushort)(SUB161(auVar25 >> 7,0) & 1) |
                            (ushort)(SUB161(auVar25 >> 0xf,0) & 1) << 1 |
                            (ushort)(SUB161(auVar25 >> 0x17,0) & 1) << 2 |
                            (ushort)(SUB161(auVar25 >> 0x1f,0) & 1) << 3 |
                            (ushort)(SUB161(auVar25 >> 0x27,0) & 1) << 4 |
                            (ushort)(SUB161(auVar25 >> 0x2f,0) & 1) << 5 |
                            (ushort)(SUB161(auVar25 >> 0x37,0) & 1) << 6 |
                            (ushort)(SUB161(auVar25 >> 0x3f,0) & 1) << 7 |
                            (ushort)(SUB161(auVar25 >> 0x47,0) & 1) << 8 |
                            (ushort)(SUB161(auVar25 >> 0x4f,0) & 1) << 9 |
                            (ushort)(SUB161(auVar25 >> 0x57,0) & 1) << 10 |
                            (ushort)(SUB161(auVar25 >> 0x5f,0) & 1) << 0xb |
                            (ushort)(SUB161(auVar25 >> 0x67,0) & 1) << 0xc |
                            (ushort)(SUB161(auVar25 >> 0x6f,0) & 1) << 0xd |
                           (ushort)(SUB161(auVar25 >> 0x77,0) & 1) << 0xe);
    if (uVar16 != 0) {
      ppVar4 = (this->configBlocks).table_.
               super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_std::vector<const_slang::ast::ConfigBlockSymbol_*>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_std::vector<const_slang::ast::ConfigBlockSymbol_*>_>_>_>
               .arrays.elements_;
      do {
        uVar9 = 0;
        if (uVar16 != 0) {
          for (; (uVar16 >> uVar9 & 1) == 0; uVar9 = uVar9 + 1) {
          }
        }
        __y = ppVar4 + uVar23 * 0xf + (ulong)uVar9;
        bVar14 = std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::operator()
                           ((equal_to<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                            &this->configBlocks,sv,&__y->first);
        if (bVar14) {
          this_00 = findDefByLib<std::vector<slang::ast::ConfigBlockSymbol_const*,std::allocator<slang::ast::ConfigBlockSymbol_const*>>const>
                              (&__y->second,target);
          if (this_00 == (remove_reference_t<decltype(defList[0])>_conflict)0x0) goto LAB_0025ec0e;
          this_00->isUsed = true;
          sVar27 = ConfigBlockSymbol::getTopCells(this_00);
          if (sVar27._M_extent._M_extent_value._M_extent_value != 1) {
            SVar28 = slang::syntax::SyntaxNode::sourceRange
                               ((SyntaxNode *)
                                &(this_00->super_Symbol).originatingSyntax[8].previewNode);
            pDVar17 = Scope::addDiag(scope,(DiagCode)0x1a000d,SVar28);
            Diagnostic::operator<<(pDVar17,(this_00->super_Symbol).name);
            SVar28 = slang::syntax::SyntaxNode::sourceRange((rule->syntax).ptr);
            Diagnostic::addNote(pDVar17,(DiagCode)0x40001,SVar28);
            goto LAB_0025ecc2;
          }
          if (rule->paramOverrides != (ParameterValueAssignmentSyntax *)0x0) {
            SVar28 = slang::syntax::SyntaxNode::sourceRange(&rule->paramOverrides->super_SyntaxNode)
            ;
            pDVar17 = Scope::addDiag(scope,(DiagCode)0x2000d,SVar28);
            Diagnostic::operator<<(pDVar17,(this_00->super_Symbol).name);
          }
          pCVar6 = (sVar27._M_ptr)->rule;
          (__return_storage_ptr__->first).definition = &(sVar27._M_ptr)->definition->super_Symbol;
          (__return_storage_ptr__->first).configRoot = this_00;
          (__return_storage_ptr__->first).configRule = pCVar6;
          goto LAB_0025eccf;
        }
        uVar16 = uVar16 - 1 & uVar16;
      } while (uVar16 != 0);
      bVar15 = pgVar3[uVar23].m[0xf].n;
    }
    if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
           is_not_overflowed(unsigned_long)::shift)[(uint)uVar19 & 7] & bVar15) == 0) break;
    uVar5 = (this->configBlocks).table_.
            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_std::vector<const_slang::ast::ConfigBlockSymbol_*>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_std::vector<const_slang::ast::ConfigBlockSymbol_*>_>_>_>
            .arrays.groups_size_mask;
    lVar24 = uVar23 + uVar22;
    uVar22 = uVar22 + 1;
    uVar23 = lVar24 + 1U & uVar5;
  } while (uVar22 <= uVar5);
LAB_0025ec0e:
  errorMissingDef(this,(rule->useCell).name,
                  &((this->root)._M_t.
                    super___uniq_ptr_impl<slang::ast::RootSymbol,_std::default_delete<slang::ast::RootSymbol>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_slang::ast::RootSymbol_*,_std::default_delete<slang::ast::RootSymbol>_>
                    .super__Head_base<0UL,_slang::ast::RootSymbol_*,_false>._M_head_impl)->
                   super_Scope,(rule->useCell).sourceRange,(DiagCode)0xcf0006);
LAB_0025ecc2:
  (__return_storage_ptr__->first).definition = (Symbol *)0x0;
  (__return_storage_ptr__->first).configRoot = (ConfigBlockSymbol *)0x0;
  (__return_storage_ptr__->first).configRule = (ConfigRule *)0x0;
LAB_0025eccf:
  __return_storage_ptr__->second = true;
  return __return_storage_ptr__;
}

Assistant:

std::pair<Compilation::DefinitionLookupResult, bool> Compilation::resolveConfigRule(
    const Scope& scope, const ConfigRule& rule) const {

    rule.isUsed = true;
    auto& id = rule.useCell;
    SLANG_ASSERT(!id.name.empty());

    // Figure out the target library.
    const SourceLibrary* overrideLib = defaultLibPtr;
    if (id.lib.empty()) {
        if (auto parentDef = scope.asSymbol().getDeclaringDefinition())
            overrideLib = &parentDef->sourceLibrary;
    }
    else {
        overrideLib = getSourceLibrary(id.lib);
        if (!overrideLib) {
            root->addDiag(diag::UnknownLibrary, id.sourceRange) << id.lib;
            return {{}, true};
        }
    }

    if (!id.targetConfig) {
        if (auto overrideDefIt = definitionMap.find({id.name, root.get()});
            overrideDefIt != definitionMap.end()) {
            // There are definitions with this name; find the one that
            // matches our target library.
            auto result = findDefByLib(overrideDefIt->second.first, *overrideLib);
            if (result)
                return {{result, nullptr, &rule}, true};
        }
    }

    // If we didn't find a target definition, try to look for a config.
    if (auto configIt = configBlocks.find(id.name); configIt != configBlocks.end()) {
        auto result = findDefByLib(configIt->second, *overrideLib);
        if (result) {
            result->isUsed = true;
            auto topCells = result->getTopCells();
            if (topCells.size() != 1) {
                auto syntax = result->getSyntax();
                SLANG_ASSERT(syntax);

                auto range = syntax->as<ConfigDeclarationSyntax>().topCells.sourceRange();
                auto& diag = scope.addDiag(diag::NestedConfigMultipleTops, range);
                diag << result->name;
                diag.addNote(diag::NoteConfigRule, rule.syntax->sourceRange());

                return {{}, true};
            }

            if (rule.paramOverrides) {
                scope.addDiag(diag::ConfigParamsIgnored, rule.paramOverrides->sourceRange())
                    << result->name;
            }

            return {{&topCells[0].definition, result, topCells[0].rule}, true};
        }
    }

    // Otherwise we have an error.
    errorMissingDef(id.name, *root, id.sourceRange, diag::UnknownModule);
    return {{}, true};
}